

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compression.cpp
# Opt level: O0

bool ZAP::supportsCompression(Compression compression)

{
  undefined1 local_9;
  Compression compression_local;
  
  if (compression == NONE) {
    local_9 = true;
  }
  else if (compression == LZ4) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool supportsCompression(Compression compression)
	{
		switch (compression)
		{
		case Compression::NONE: return true;
		#ifdef ZAP_COMPRESS_LZ4
		case Compression::LZ4: return true;
		#endif
		default: return false;
		}
	}